

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributePdu.cpp
# Opt level: O0

void __thiscall DIS::AttributePdu::marshal(AttributePdu *this,DataStream *dataStream)

{
  DataStream *dataStream_local;
  AttributePdu *this_local;
  
  EntityInformationFamilyPdu::marshal(&this->super_EntityInformationFamilyPdu,dataStream);
  SimulationAddress::marshal(&this->_originatingSimulationAddress,dataStream);
  DataStream::operator<<(dataStream,this->_padding1);
  DataStream::operator<<(dataStream,this->_padding2);
  DataStream::operator<<(dataStream,this->_attributeRecordPduType);
  DataStream::operator<<(dataStream,this->_attributeRecordProtocolVersion);
  DataStream::operator<<(dataStream,this->_masterAttributeRecordType);
  DataStream::operator<<(dataStream,this->_actionCode);
  DataStream::operator<<(dataStream,this->_padding3);
  DataStream::operator<<(dataStream,this->_numberAttributeRecordSet);
  return;
}

Assistant:

void AttributePdu::marshal(DataStream& dataStream) const
{
    EntityInformationFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _originatingSimulationAddress.marshal(dataStream);
    dataStream << _padding1;
    dataStream << _padding2;
    dataStream << _attributeRecordPduType;
    dataStream << _attributeRecordProtocolVersion;
    dataStream << _masterAttributeRecordType;
    dataStream << _actionCode;
    dataStream << _padding3;
    dataStream << _numberAttributeRecordSet;
}